

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O1

void abort_save_pos_for_undo_proc(Am_Object *command_obj)

{
  Am_Value *in_value;
  Am_Object scrollbar;
  Am_Value old_value;
  Am_Object scroll_command;
  Am_Object AStack_38;
  Am_Value local_30;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Object::Am_Object(&local_18,command_obj);
  clear_save_pos_for_undo_proc(&local_18);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Get_Object((Am_Object *)&local_30,(Am_Slot_Key)command_obj,10);
  Am_Object::Get_Object(&AStack_38,(Am_Slot_Key)&local_30,10);
  Am_Object::~Am_Object((Am_Object *)&local_30);
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)&AStack_38,0xc5);
  local_30.type = 0;
  local_30.value.wrapper_value = (Am_Wrapper *)0x0;
  in_value = Am_Object::Get(&local_20,0x16c,1);
  Am_Value::operator=(&local_30,in_value);
  Am_Object::Set(&AStack_38,0x169,&local_30,0);
  Am_Value::~Am_Value(&local_30);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&AStack_38);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, abort_save_pos_for_undo,
                 (Am_Object command_obj))
{
  clear_save_pos_for_undo_proc(command_obj);
  //first owner is the interactor
  Am_Object scrollbar = command_obj.Get_Owner().Get_Owner();
  Am_Object scroll_command = scrollbar.Get_Object(Am_COMMAND);
  Am_Value old_value;
  old_value = scroll_command.Peek(Am_OLD_VALUE);
  scrollbar.Set(Am_VALUE, old_value);
  // std::cout << "...Aborting, setting " << scrollbar << " value with " <<
  //   old_value  << " from " << scroll_command <<std::endl <<std::flush;
}